

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm_regression.c
# Opt level: O0

void snprint_insn_detail(char *buf,size_t *cur,size_t *left,cs_insn *ins)

{
  long lVar1;
  uint uVar2;
  cs_detail *pcVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  size_t used_16;
  size_t used_15;
  size_t used_14;
  size_t used_13;
  size_t used_12;
  size_t used_11;
  size_t used_10;
  size_t used_9;
  size_t used_8;
  size_t used_7;
  size_t used_6;
  size_t used_5;
  size_t used_4;
  size_t used_3;
  size_t used_2;
  cs_arm_op *op;
  size_t used_1;
  int i;
  cs_arm *arm;
  size_t used;
  cs_insn *ins_local;
  size_t *left_local;
  size_t *cur_local;
  char *buf_local;
  
  if (ins->detail != (cs_detail *)0x0) {
    pcVar3 = ins->detail;
    if ((pcVar3->field_6).arm.op_count != '\0') {
      iVar6 = snprintf(buf + *cur,*left,"\top_count: %u\n",(ulong)(pcVar3->field_6).arm.op_count);
      *left = *left - (long)iVar6;
      *cur = (long)iVar6 + *cur;
    }
    for (used_1._4_4_ = 0; (int)used_1._4_4_ < (int)(uint)(pcVar3->field_6).arm.op_count;
        used_1._4_4_ = used_1._4_4_ + 1) {
      lVar1 = (long)(int)used_1._4_4_ * 0x28;
      iVar6 = *(int *)(pcVar3->groups + lVar1 + 0x42);
      if (iVar6 == 1) {
        sVar4 = *cur;
        sVar5 = *left;
        pcVar7 = cs_reg_name(handle,*(uint *)(pcVar3->groups + lVar1 + 0x46));
        iVar6 = snprintf(buf + sVar4,sVar5,"\t\toperands[%u].type: REG = %s\n",(ulong)used_1._4_4_,
                         pcVar7);
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
      }
      else if (iVar6 == 2) {
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: IMM = 0x%x\n",(ulong)used_1._4_4_,
                         (ulong)*(uint *)(pcVar3->groups + lVar1 + 0x46));
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
      }
      else if (iVar6 == 3) {
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: MEM\n",(ulong)used_1._4_4_);
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
        if (*(int *)(pcVar3->groups + lVar1 + 0x46) != 0) {
          sVar4 = *cur;
          sVar5 = *left;
          pcVar7 = cs_reg_name(handle,*(uint *)(pcVar3->groups + lVar1 + 0x46));
          iVar6 = snprintf(buf + sVar4,sVar5,"\t\t\toperands[%u].mem.base: REG = %s\n",
                           (ulong)used_1._4_4_,pcVar7);
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
        if (*(int *)(pcVar3->groups + lVar1 + 0x4a) != 0) {
          sVar4 = *cur;
          sVar5 = *left;
          pcVar7 = cs_reg_name(handle,*(uint *)(pcVar3->groups + lVar1 + 0x4a));
          iVar6 = snprintf(buf + sVar4,sVar5,"\t\t\toperands[%u].mem.index: REG = %s\n",
                           (ulong)used_1._4_4_,pcVar7);
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
        if (*(int *)(pcVar3->groups + lVar1 + 0x4e) != 1) {
          iVar6 = snprintf(buf + *cur,*left,"\t\t\toperands[%u].mem.scale: %u\n",(ulong)used_1._4_4_
                           ,(ulong)*(uint *)(pcVar3->groups + lVar1 + 0x4e));
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
        if (*(int *)(pcVar3->groups + lVar1 + 0x52) != 0) {
          iVar6 = snprintf(buf + *cur,*left,"\t\t\toperands[%u].mem.disp: 0x%x\n",
                           (ulong)used_1._4_4_,(ulong)*(uint *)(pcVar3->groups + lVar1 + 0x52));
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
      }
      else if (iVar6 == 4) {
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: FP = %f\n",
                         *(undefined8 *)(pcVar3->groups + lVar1 + 0x46),(ulong)used_1._4_4_);
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
      }
      else if (iVar6 == 0x40) {
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: C-IMM = %u\n",(ulong)used_1._4_4_,
                         (ulong)*(uint *)(pcVar3->groups + lVar1 + 0x46));
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
      }
      else if (iVar6 == 0x41) {
        iVar6 = snprintf(buf + *cur,*left,"\t\toperands[%u].type: P-IMM = %u\n",(ulong)used_1._4_4_,
                         (ulong)*(uint *)(pcVar3->groups + lVar1 + 0x46));
        *left = *left - (long)iVar6;
        *cur = (long)iVar6 + *cur;
      }
      if ((*(int *)(pcVar3->groups + lVar1 + 0x3a) != 0) &&
         (*(int *)(pcVar3->groups + lVar1 + 0x3e) != 0)) {
        if (*(uint *)(pcVar3->groups + lVar1 + 0x3a) < 6) {
          iVar6 = snprintf(buf + *cur,*left,"\t\t\tShift: %u = %u\n",
                           (ulong)*(uint *)(pcVar3->groups + lVar1 + 0x3a),
                           (ulong)*(uint *)(pcVar3->groups + lVar1 + 0x3e));
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
        else {
          sVar4 = *cur;
          sVar5 = *left;
          uVar2 = *(uint *)(pcVar3->groups + lVar1 + 0x3a);
          pcVar7 = cs_reg_name(handle,*(uint *)(pcVar3->groups + lVar1 + 0x3e));
          iVar6 = snprintf(buf + sVar4,sVar5,"\t\t\tShift: %u = %s\n",(ulong)uVar2,pcVar7);
          *left = *left - (long)iVar6;
          *cur = (long)iVar6 + *cur;
        }
      }
    }
    if (((pcVar3->field_6).arm64.operands[0].shift.type != 0xf) &&
       ((pcVar3->field_6).arm64.operands[0].shift.type != ARM64_SFT_INVALID)) {
      iVar6 = snprintf(buf + *cur,*left,"\tCode condition: %u\n",(ulong)(pcVar3->field_6).arm.cc);
      *left = *left - (long)iVar6;
      *cur = (long)iVar6 + *cur;
    }
    if (((pcVar3->field_6).arm.update_flags & 1U) != 0) {
      iVar6 = snprintf(buf + *cur,*left,"\tUpdate-flags: True\n");
      *left = *left - (long)iVar6;
      *cur = (long)iVar6 + *cur;
    }
    if (((pcVar3->field_6).arm.writeback & 1U) != 0) {
      iVar6 = snprintf(buf + *cur,*left,"\tWrite-back: True\n");
      *left = *left - (long)iVar6;
      *cur = (long)iVar6 + *cur;
    }
  }
  return;
}

Assistant:

static void snprint_insn_detail(char * buf, size_t * cur, size_t * left, cs_insn *ins)
{
	size_t used = 0;

#define _this_printf(...) \
	{ \
		size_t used = 0; \
		used = snprintf(buf + *cur, *left, __VA_ARGS__); \
		*left -= used; \
		*cur += used; \
	}

	cs_arm *arm;
	int i;

	// detail can be NULL on "data" instruction if SKIPDATA option is turned ON
	if (ins->detail == NULL)
		return;

	arm = &(ins->detail->arm);

	if (arm->op_count)
		_this_printf("\top_count: %u\n", arm->op_count);

	for (i = 0; i < arm->op_count; i++) {
		cs_arm_op *op = &(arm->operands[i]);
		switch((int)op->type) {
			default:
				break;
			case ARM_OP_REG:
				_this_printf("\t\toperands[%u].type: REG = %s\n", i, cs_reg_name(handle, op->reg));
				break;
			case ARM_OP_IMM:
				_this_printf("\t\toperands[%u].type: IMM = 0x%x\n", i, op->imm);
				break;
			case ARM_OP_FP:
				_this_printf("\t\toperands[%u].type: FP = %f\n", i, op->fp);
				break;
			case ARM_OP_MEM:
				_this_printf("\t\toperands[%u].type: MEM\n", i);
				if (op->mem.base != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.base: REG = %s\n",
							i, cs_reg_name(handle, op->mem.base));
				if (op->mem.index != X86_REG_INVALID)
					_this_printf("\t\t\toperands[%u].mem.index: REG = %s\n",
							i, cs_reg_name(handle, op->mem.index));
				if (op->mem.scale != 1)
					_this_printf("\t\t\toperands[%u].mem.scale: %u\n", i, op->mem.scale);
				if (op->mem.disp != 0)
					_this_printf("\t\t\toperands[%u].mem.disp: 0x%x\n", i, op->mem.disp);

				break;
			case ARM_OP_PIMM:
				_this_printf("\t\toperands[%u].type: P-IMM = %u\n", i, op->imm);
				break;
			case ARM_OP_CIMM:
				_this_printf("\t\toperands[%u].type: C-IMM = %u\n", i, op->imm);
				break;
		}

		if (op->shift.type != ARM_SFT_INVALID && op->shift.value) {
			if (op->shift.type < ARM_SFT_ASR_REG) {
				// shift with constant value
				_this_printf("\t\t\tShift: %u = %u\n", op->shift.type, op->shift.value);
			} else {
				// shift with register
				_this_printf("\t\t\tShift: %u = %s\n", op->shift.type,
						cs_reg_name(handle, op->shift.value));
			}
		}
	}

	if (arm->cc != ARM_CC_AL && arm->cc != ARM_CC_INVALID) {
		_this_printf("\tCode condition: %u\n", arm->cc);
	}

	if (arm->update_flags) {
		_this_printf("\tUpdate-flags: True\n");
	}

	if (arm->writeback) {
		_this_printf("\tWrite-back: True\n");
	}

#undef _this_printf
}